

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O2

void __thiscall
neural_networks::NeuralNetwork::NeuralNetwork
          (NeuralNetwork *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *dimensions,
          string *new_label,longdouble rate)

{
  pointer puVar1;
  NeuralLayer *pNVar2;
  ulong uVar3;
  allocator_type local_91;
  vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
  *local_90;
  longdouble local_88;
  string local_78;
  string local_58;
  value_type local_38;
  
  local_88 = rate;
  this->_vptr_NeuralNetwork = (_func_int **)&PTR_set_data_0010bd38;
  local_90 = &this->layers;
  local_38 = (value_type)0x0;
  std::
  vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
  ::vector(local_90,(long)(dimensions->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                    (long)(dimensions->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start >> 3,&local_38,&local_91);
  this->learning_rate = local_88;
  std::__cxx11::string::string((string *)&this->label,(string *)new_label);
  local_88 = (longdouble)CONCAT28(local_88._8_2_,&this->label);
  pNVar2 = (NeuralLayer *)operator_new(0x50);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  utilities::NeuralLayer::NeuralLayer
            (pNVar2,*(dimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                     ._M_impl.super__Vector_impl_data._M_start,0,&local_58);
  *(local_90->
   super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
   )._M_impl.super__Vector_impl_data._M_start = pNVar2;
  std::__cxx11::string::~string((string *)&local_58);
  for (uVar3 = 1;
      puVar1 = (dimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(dimensions->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      uVar3 = uVar3 + 1) {
    pNVar2 = (NeuralLayer *)operator_new(0x50);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    utilities::NeuralLayer::NeuralLayer(pNVar2,puVar1[uVar3],puVar1[uVar3 - 1],&local_78);
    (local_90->
    super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
    )._M_impl.super__Vector_impl_data._M_start[uVar3] = pNVar2;
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

NeuralNetwork::NeuralNetwork(const std::vector<size_t>& dimensions, std::string new_label, long double rate) :
        layers(dimensions.size(), nullptr), label(new_label), learning_rate(rate) {
    layers[0] = new utilities::NeuralLayer(dimensions[0], 0);
    for(register size_t i = 1; i < dimensions.size(); ++i) {
        layers[i] = new utilities::NeuralLayer(dimensions[i], dimensions[i - 1]);
    }
}